

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGenerator.cpp
# Opt level: O3

void __thiscall
InstructionGenerator::genCreateString(InstructionGenerator *this,string *identifier,string *val)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  pointer puVar1;
  iterator iVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  size_type sVar3;
  char *c;
  pointer pcVar4;
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  char local_38 [16];
  bool local_28;
  uint local_24;
  
  this_01 = this->bytecode;
  local_50._0_4_ = 4;
  iVar2._M_current =
       (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  puVar1 = (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar2._M_current == puVar1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<Instruction>
              (this_01,iVar2,(Instruction *)local_50);
    this_01 = this->bytecode;
    iVar2._M_current =
         (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    puVar1 = (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = 4;
    iVar2._M_current = iVar2._M_current + 1;
    (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  sVar3 = val->_M_string_length;
  local_50 = (undefined1  [8])sVar3;
  if (iVar2._M_current == puVar1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_long>
              (this_01,iVar2,(unsigned_long *)local_50);
    sVar3 = val->_M_string_length;
  }
  else {
    *iVar2._M_current = (uint)sVar3;
    (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  if (sVar3 != 0) {
    pcVar4 = (val->_M_dataplus)._M_p;
    do {
      this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)this->bytecode;
      iVar2._M_current = *(uint **)(this_00 + 8);
      if (iVar2._M_current == *(uint **)(this_00 + 0x10)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<char_const&>
                  (this_00,iVar2,pcVar4);
      }
      else {
        *iVar2._M_current = (int)*pcVar4;
        *(uint **)(this_00 + 8) = iVar2._M_current + 1;
      }
      pcVar4 = pcVar4 + 1;
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
  }
  local_50._0_4_ = 3;
  pcVar4 = (identifier->_M_dataplus)._M_p;
  local_48._M_p = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar4,pcVar4 + identifier->_M_string_length);
  local_28 = false;
  local_24 = 0;
  VirtualStack::push(&this->super_VirtualStack,(Variable *)local_50);
  if (local_48._M_p != local_38) {
    operator_delete(local_48._M_p);
  }
  return;
}

Assistant:

void InstructionGenerator::genCreateString(const std::string &identifier, const std::string &val)
{
    bytecode->emplace_back(Instruction::CREATE_STRING);
    bytecode->emplace_back(val.size());
    for(const auto &c : val)
        bytecode->emplace_back(c);
    push(Variable(identifier, DataType::STRING));
}